

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O3

void __thiscall sf::priv::JoystickManager::update(JoystickManager *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int __oflag;
  JoystickState *pJVar4;
  JoystickImpl *pJVar5;
  ulong uVar6;
  byte bVar7;
  JoystickCaps JVar8;
  JoystickState local_70;
  
  bVar7 = 0;
  uVar6 = 0;
  do {
    if ((char)((JoystickImpl *)((long)this + 0xb0))->m_file == '\x01') {
      JoystickImpl::update(&local_70,(JoystickImpl *)this);
      pJVar4 = &local_70;
      pJVar5 = (JoystickImpl *)((long)this + 0xb0);
      for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
        pJVar5->m_file = *(int *)pJVar4;
        pJVar4 = (JoystickState *)((long)pJVar4 + (ulong)bVar7 * -8 + 4);
        pJVar5 = (JoystickImpl *)((long)pJVar5 + (ulong)bVar7 * -8 + 4);
      }
      if ((char)((JoystickImpl *)((long)this + 0xb0))->m_file == '\0') {
        JoystickImpl::close((JoystickImpl *)this,(int)pJVar4);
        *(undefined4 *)&((JoystickImpl *)((long)this + 0xb0))->m_state = 0;
        (((JoystickImpl *)((long)this + 0xb0))->m_state).axes[0] = 0.0;
        (((JoystickImpl *)((long)this + 0xb0))->m_state).axes[1] = 0.0;
        local_70.buttons[0xf] = false;
        local_70.buttons[0x10] = false;
        local_70.buttons[0x11] = false;
        local_70.buttons[0x12] = false;
        local_70.buttons[0x13] = false;
        local_70.buttons[0x14] = false;
        local_70.buttons[0x15] = false;
        local_70.buttons[0x16] = false;
        local_70.buttons[0x17] = false;
        local_70.buttons[0x18] = false;
        local_70.buttons[0x19] = false;
        local_70.buttons[0x1a] = false;
        local_70.buttons[0x1b] = false;
        local_70.buttons[0x1c] = false;
        local_70.buttons[0x1d] = false;
        local_70.buttons[0x1e] = false;
        local_70._35_5_ = 0;
        local_70.buttons[4] = false;
        local_70.buttons[5] = false;
        local_70.buttons[6] = false;
        local_70.buttons[7] = false;
        local_70.buttons[8] = false;
        local_70.buttons[9] = false;
        local_70.buttons[10] = false;
        local_70.buttons[0xb] = false;
        local_70.buttons[0xc] = false;
        local_70.buttons[0xd] = false;
        local_70.buttons[0xe] = false;
        local_70.axes._15_8_ = 0;
        local_70.axes._23_5_ = 0;
        local_70.axes[7]._0_3_ = 0;
        local_70._3_1_ = 0;
        local_70.axes[0] = 0.0;
        local_70.axes[1]._0_3_ = 0;
        local_70.axes._7_8_ = 0;
        *(undefined1 *)&((JoystickImpl *)((long)this + 0xb0))->m_file = 0;
        memcpy((void *)((long)&((JoystickImpl *)((long)this + 0xb0))->m_file + 1),&local_70,0x43);
        Joystick::Identification::Identification((Identification *)&local_70);
        String::operator=((String *)((((JoystickImpl *)((long)this + 0xb0))->m_state).axes + 2),
                          (String *)&local_70);
LAB_001eab70:
        *(ulong *)((((JoystickImpl *)((long)this + 0xb0))->m_state).buttons + 8) =
             CONCAT53(local_70._35_5_,local_70.axes[7]._0_3_);
        if ((float *)CONCAT53(local_70._3_5_,local_70._0_3_) != local_70.axes + 3) {
          operator_delete((undefined1 *)CONCAT53(local_70._3_5_,local_70._0_3_));
        }
      }
    }
    else {
      bVar1 = JoystickImpl::isConnected((uint)uVar6);
      if (bVar1) {
        iVar2 = JoystickImpl::open((JoystickImpl *)this,(char *)(uVar6 & 0xffffffff),__oflag);
        if ((char)iVar2 != '\0') {
          JVar8 = JoystickImpl::getCapabilities((JoystickImpl *)this);
          *(JoystickCaps *)&((JoystickImpl *)((long)this + 0xb0))->m_state = JVar8;
          JoystickImpl::update(&local_70,(JoystickImpl *)this);
          pJVar4 = &local_70;
          pJVar5 = (JoystickImpl *)((long)this + 0xb0);
          for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
            pJVar5->m_file = *(int *)pJVar4;
            pJVar4 = (JoystickState *)((long)pJVar4 + (ulong)bVar7 * -8 + 4);
            pJVar5 = (JoystickImpl *)((long)pJVar5 + (ulong)bVar7 * -8 + 4);
          }
          JoystickImpl::getIdentification((Identification *)&local_70,(JoystickImpl *)this);
          String::operator=((String *)((((JoystickImpl *)((long)this + 0xb0))->m_state).axes + 2),
                            (String *)&local_70);
          goto LAB_001eab70;
        }
      }
    }
    uVar6 = uVar6 + 1;
    this = (JoystickManager *)((((JoystickImpl *)((long)this + 0xb0))->m_state).buttons + 0x10);
    if (uVar6 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void JoystickManager::update()
{
    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        Item& item = m_joysticks[i];

        if (item.state.connected)
        {
            // Get the current state of the joystick
            item.state = item.joystick.update();

            // Check if it's still connected
            if (!item.state.connected)
            {
                item.joystick.close();
                item.capabilities   = JoystickCaps();
                item.state          = JoystickState();
                item.identification = Joystick::Identification();
            }
        }
        else
        {
            // Check if the joystick was connected since last update
            if (JoystickImpl::isConnected(i))
            {
                if (item.joystick.open(i))
                {
                    item.capabilities   = item.joystick.getCapabilities();
                    item.state          = item.joystick.update();
                    item.identification = item.joystick.getIdentification();
                }
            }
        }
    }
}